

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_starts_with_Test<std::pair<char8_t,_char16_t>_>::TestBody
          (UnicodeFullTest_starts_with_Test<std::pair<char8_t,_char16_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  size_t sVar3;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [5];
  char32_t (*extraout_RDX_00) [5];
  char32_t (*extraout_RDX_01) [5];
  char32_t (*extraout_RDX_02) [5];
  char32_t (*extraout_RDX_03) [5];
  char32_t (*extraout_RDX_04) [5];
  char32_t (*extraout_RDX_05) [5];
  char32_t (*in_string_00) [5];
  char32_t (*extraout_RDX_07) [5];
  char32_t (*extraout_RDX_08) [5];
  char32_t (*extraout_RDX_09) [5];
  char32_t (*extraout_RDX_10) [5];
  char32_t (*extraout_RDX_11) [5];
  char32_t (*extraout_RDX_12) [5];
  char32_t (*in_string_01) [5];
  char32_t (*extraout_RDX_14) [5];
  char32_t (*extraout_RDX_15) [5];
  char32_t (*extraout_RDX_16) [5];
  char32_t (*extraout_RDX_17) [5];
  char32_t (*extraout_RDX_18) [5];
  char32_t (*extraout_RDX_19) [5];
  char32_t (*in_string_02) [5];
  char32_t (*extraout_RDX_21) [5];
  char32_t (*extraout_RDX_22) [5];
  char32_t (*extraout_RDX_23) [5];
  char32_t (*extraout_RDX_24) [5];
  char32_t (*extraout_RDX_25) [5];
  char32_t (*extraout_RDX_26) [5];
  char32_t (*in_string_03) [5];
  char32_t (*extraout_RDX_28) [5];
  char32_t (*extraout_RDX_29) [5];
  char32_t (*extraout_RDX_30) [5];
  char32_t (*extraout_RDX_31) [5];
  char32_t (*extraout_RDX_32) [5];
  char32_t (*extraout_RDX_33) [5];
  char32_t (*in_string_04) [7];
  char32_t (*extraout_RDX_35) [5];
  char32_t (*extraout_RDX_36) [5];
  char32_t (*extraout_RDX_37) [5];
  char32_t (*extraout_RDX_38) [5];
  char32_t (*extraout_RDX_39) [5];
  char32_t (*extraout_RDX_40) [5];
  char32_t (*in_string_05) [7];
  char32_t (*extraout_RDX_42) [5];
  char32_t (*extraout_RDX_43) [5];
  char32_t (*extraout_RDX_44) [5];
  char32_t (*extraout_RDX_45) [5];
  char32_t (*extraout_RDX_46) [5];
  char32_t (*extraout_RDX_47) [5];
  char32_t (*in_string_06) [7];
  char32_t (*extraout_RDX_49) [5];
  char32_t (*extraout_RDX_50) [5];
  char32_t (*extraout_RDX_51) [5];
  char32_t (*extraout_RDX_52) [5];
  char32_t (*extraout_RDX_53) [5];
  char32_t (*extraout_RDX_54) [5];
  char32_t (*in_string_07) [7];
  char32_t (*extraout_RDX_56) [5];
  char32_t (*extraout_RDX_57) [5];
  char32_t (*extraout_RDX_58) [5];
  char32_t (*extraout_RDX_59) [5];
  char32_t (*extraout_RDX_60) [5];
  char32_t (*pacVar4) [5];
  char32_t (*extraout_RDX_61) [5];
  char32_t (*in_string_08) [7];
  char32_t (*extraout_RDX_63) [7];
  char32_t (*extraout_RDX_64) [7];
  char32_t (*extraout_RDX_65) [7];
  char32_t (*extraout_RDX_66) [7];
  char32_t (*extraout_RDX_67) [7];
  char32_t (*extraout_RDX_68) [7];
  char32_t (*in_string_09) [5];
  char32_t (*extraout_RDX_70) [7];
  char32_t (*extraout_RDX_71) [7];
  char32_t (*extraout_RDX_72) [7];
  char32_t (*extraout_RDX_73) [7];
  char32_t (*extraout_RDX_74) [7];
  char32_t (*extraout_RDX_75) [7];
  char32_t (*in_string_10) [5];
  char32_t (*extraout_RDX_77) [7];
  char32_t (*extraout_RDX_78) [7];
  char32_t (*extraout_RDX_79) [7];
  char32_t (*extraout_RDX_80) [7];
  char32_t (*extraout_RDX_81) [7];
  char32_t (*extraout_RDX_82) [7];
  char32_t (*in_string_11) [5];
  char32_t (*extraout_RDX_84) [7];
  char32_t (*extraout_RDX_85) [7];
  char32_t (*extraout_RDX_86) [7];
  char32_t (*extraout_RDX_87) [7];
  char32_t (*extraout_RDX_88) [7];
  char32_t (*extraout_RDX_89) [7];
  char32_t (*in_string_12) [5];
  char32_t (*extraout_RDX_91) [7];
  char32_t (*extraout_RDX_92) [7];
  char32_t (*extraout_RDX_93) [7];
  char32_t (*extraout_RDX_94) [7];
  char32_t (*extraout_RDX_95) [7];
  char32_t (*pacVar5) [7];
  char32_t (*extraout_RDX_96) [7];
  char32_t (*in_string_13) [5];
  pointer *__ptr;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_01;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_02;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_03;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_04;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_05;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_06;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_07;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_08;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_09;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_10;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_11;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_12;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_13;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_14;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_15;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_16;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_17;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_18;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_19;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_20;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_21;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_22;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_23;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_24;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_25;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_26;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_27;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_28;
  AssertionResult gtest_ar_;
  AssertHelper aAStack_78 [8];
  char local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_60;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_40;
  char32_t (*extraout_RDX) [5];
  char32_t (*extraout_RDX_06) [5];
  char32_t (*extraout_RDX_13) [5];
  char32_t (*extraout_RDX_20) [5];
  char32_t (*extraout_RDX_27) [5];
  char32_t (*extraout_RDX_34) [5];
  char32_t (*extraout_RDX_41) [5];
  char32_t (*extraout_RDX_48) [5];
  char32_t (*extraout_RDX_55) [5];
  char32_t (*extraout_RDX_62) [7];
  char32_t (*extraout_RDX_69) [7];
  char32_t (*extraout_RDX_76) [7];
  char32_t (*extraout_RDX_83) [7];
  char32_t (*extraout_RDX_90) [7];
  
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string);
  in_prefix._M_str = local_40._M_dataplus._M_p;
  in_prefix._M_len = local_40._M_string_length;
  in_string_14._M_str = local_60._M_dataplus._M_p;
  in_string_14._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_14,in_prefix);
  local_70[0] = sVar3 != 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_40.field_2;
  pacVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_00;
  }
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_01;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd0,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_03;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_04;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_05;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",pacVar4);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_00);
  in_prefix_00._M_str = local_40._M_dataplus._M_p;
  in_prefix_00._M_len = local_40._M_string_length;
  in_string_15._M_str = local_60._M_dataplus._M_p;
  in_string_15._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_15,in_prefix_00);
  local_70[0] = sVar3 != 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_08;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd2,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_09;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_10;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_11;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_12;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",pacVar4);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_01);
  in_prefix_01._M_str = local_40._M_dataplus._M_p;
  in_prefix_01._M_len = local_40._M_string_length;
  in_string_16._M_str = local_60._M_dataplus._M_p;
  in_string_16._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_16,in_prefix_01);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_15;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd4,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_17;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_18;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_19;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",pacVar4);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_02);
  in_prefix_02._M_str = local_40._M_dataplus._M_p;
  in_prefix_02._M_len = local_40._M_string_length;
  in_string_17._M_str = local_60._M_dataplus._M_p;
  in_string_17._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_17,in_prefix_02);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_21;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_22;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd6,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_23;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_24;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_25;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_26;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"ABcd",pacVar4);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abCD",in_string_03);
  in_prefix_03._M_str = local_40._M_dataplus._M_p;
  in_prefix_03._M_len = local_40._M_string_length;
  in_string_18._M_str = local_60._M_dataplus._M_p;
  in_string_18._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_18,in_prefix_03);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_28;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_29;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd8,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_31;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_32;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_33;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",pacVar4);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"ABCDzz",in_string_04);
  in_prefix_04._M_str = local_40._M_dataplus._M_p;
  in_prefix_04._M_len = local_40._M_string_length;
  in_string_19._M_str = local_60._M_dataplus._M_p;
  in_string_19._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_19,in_prefix_04);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_34;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_35;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_36;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xdc,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_37;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_38;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_39;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_40;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",pacVar4);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"abcdzz",in_string_05);
  in_prefix_05._M_str = local_40._M_dataplus._M_p;
  in_prefix_05._M_len = local_40._M_string_length;
  in_string_20._M_str = local_60._M_dataplus._M_p;
  in_string_20._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_20,in_prefix_05);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_41;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_42;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_43;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xde,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_44;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_45;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_46;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_47;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",pacVar4);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"abcdzz",in_string_06);
  in_prefix_06._M_str = local_40._M_dataplus._M_p;
  in_prefix_06._M_len = local_40._M_string_length;
  in_string_21._M_str = local_60._M_dataplus._M_p;
  in_string_21._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_21,in_prefix_06);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_48;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_49;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_50;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe0,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_51;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_52;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_53;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_54;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",pacVar4);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"ABCDzz",in_string_07);
  in_prefix_07._M_str = local_40._M_dataplus._M_p;
  in_prefix_07._M_len = local_40._M_string_length;
  in_string_22._M_str = local_60._M_dataplus._M_p;
  in_string_22._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_22,in_prefix_07);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_55;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_56;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_57;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe2,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar4 = extraout_RDX_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_59;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_60;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar4 = extraout_RDX_61;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_60,(jessilib *)L"ABcd",pacVar4);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"abCDzz",in_string_08);
  in_prefix_08._M_str = local_40._M_dataplus._M_p;
  in_prefix_08._M_len = local_40._M_string_length;
  in_string_23._M_str = local_60._M_dataplus._M_p;
  in_string_23._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_23,in_prefix_08);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_62;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_63;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_64;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe4,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar5 = extraout_RDX_65;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_66;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_67;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar5 = extraout_RDX_68;
  }
  jessilib::string_cast<char8_t,char32_t[7]>(&local_60,(jessilib *)L"ABCDzz",pacVar5);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_09);
  in_prefix_09._M_str = local_40._M_dataplus._M_p;
  in_prefix_09._M_len = local_40._M_string_length;
  in_string_24._M_str = local_60._M_dataplus._M_p;
  in_string_24._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_24,in_prefix_09);
  local_70[0] = sVar3 != 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_69;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_70;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_71;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe8,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar5 = extraout_RDX_72;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_73;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_74;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar5 = extraout_RDX_75;
  }
  jessilib::string_cast<char8_t,char32_t[7]>(&local_60,(jessilib *)L"abcdzz",pacVar5);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_10);
  in_prefix_10._M_str = local_40._M_dataplus._M_p;
  in_prefix_10._M_len = local_40._M_string_length;
  in_string_25._M_str = local_60._M_dataplus._M_p;
  in_string_25._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_25,in_prefix_10);
  local_70[0] = sVar3 != 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_76;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_77;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_78;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xea,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar5 = extraout_RDX_79;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_80;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_81;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar5 = extraout_RDX_82;
  }
  jessilib::string_cast<char8_t,char32_t[7]>(&local_60,(jessilib *)L"ABCDzz",pacVar5);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_11);
  in_prefix_11._M_str = local_40._M_dataplus._M_p;
  in_prefix_11._M_len = local_40._M_string_length;
  in_string_26._M_str = local_60._M_dataplus._M_p;
  in_string_26._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_26,in_prefix_11);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_83;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_84;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_85;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xec,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar5 = extraout_RDX_86;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_87;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_88;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar5 = extraout_RDX_89;
  }
  jessilib::string_cast<char8_t,char32_t[7]>(&local_60,(jessilib *)L"abcdzz",pacVar5);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_12);
  in_prefix_12._M_str = local_40._M_dataplus._M_p;
  in_prefix_12._M_len = local_40._M_string_length;
  in_string_27._M_str = local_60._M_dataplus._M_p;
  in_string_27._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_27,in_prefix_12);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_91;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    pacVar5 = extraout_RDX_92;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xee,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar5 = extraout_RDX_93;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_94;
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_95;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar5 = extraout_RDX_96;
  }
  jessilib::string_cast<char8_t,char32_t[7]>(&local_60,(jessilib *)L"ABcdzz",pacVar5);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abCD",in_string_13);
  in_prefix_13._M_str = local_40._M_dataplus._M_p;
  in_prefix_13._M_len = local_40._M_string_length;
  in_string_28._M_str = local_60._M_dataplus._M_p;
  in_string_28._M_len = local_60._M_string_length;
  sVar3 = jessilib::starts_with_length<char8_t,char16_t>(in_string_28,in_prefix_13);
  local_70[0] = sVar3 == 0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xf0,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_40._M_dataplus._M_p != (char16_t *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, starts_with) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	// TypeParam::first_type starts_with TypeParam::second_type... (always false)
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCDzz")));

	// TypeParam::first_type... starts_with TypeParam::second_type (always same results as first)
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}